

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,wstring *wideString)

{
  long lVar1;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  output;
  wstring *wideString_local;
  String *this_local;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(&this->m_string);
  lVar1 = std::__cxx11::wstring::length();
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::reserve
            (&this->m_string,lVar1 + 1);
  begin._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  end._M_current = (wchar_t *)std::__cxx11::wstring::end();
  output = std::
           back_inserter<std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>
                     (&this->m_string);
  Utf<32u>::
  fromWide<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>>
            (begin,end,output);
  return;
}

Assistant:

String::String(const std::wstring& wideString)
{
    m_string.reserve(wideString.length() + 1);
    Utf32::fromWide(wideString.begin(), wideString.end(), std::back_inserter(m_string));
}